

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O1

REF_STATUS ref_subdiv_test_impossible_marks(REF_SUBDIV ref_subdiv)

{
  REF_CELL ref_cell;
  REF_NODE pRVar1;
  REF_DBL *pRVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  REF_INT edge;
  ulong uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  REF_DBL RVar15;
  REF_DBL RVar16;
  REF_DBL xyz [6] [3];
  REF_INT nodes [27];
  REF_BOOL possible;
  double local_158;
  double local_150;
  double local_148;
  double local_140;
  double local_138;
  double local_130;
  double local_128;
  double local_120;
  double local_118;
  double local_110;
  double local_108;
  double local_100;
  double local_f8;
  double local_f0;
  double local_e8;
  double local_e0;
  double local_d8;
  double local_d0;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  double local_50;
  double local_48;
  double local_40;
  REF_BOOL local_34;
  
  ref_cell = ref_subdiv->grid->cell[10];
  if (0 < ref_cell->max) {
    pRVar1 = ref_subdiv->grid->node;
    uVar9 = 0;
    do {
      iVar8 = (int)uVar9;
      if (ref_cell->c2n[(long)iVar8 * (long)ref_cell->size_per] != -1) {
        uVar3 = ref_subdiv_map(ref_subdiv,ref_cell,iVar8);
        uVar4 = ref_cell_nodes(ref_cell,iVar8,&local_c8);
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0x988,"ref_subdiv_test_impossible_marks",(ulong)uVar4,"nodes");
          return uVar4;
        }
        if ((int)uVar3 < 0x82) {
          if (uVar3 == 0) goto LAB_00202487;
          if (uVar3 == 0x34) {
            pRVar2 = pRVar1->real;
            lVar6 = (long)local_c8;
            lVar7 = (long)local_c4;
            lVar11 = (long)local_c0;
            lVar12 = (long)local_bc;
            lVar13 = (long)local_b8;
            local_48 = pRVar2[lVar13 * 0xf + 2];
            lVar14 = (long)local_b4;
            local_40 = pRVar2[lVar14 * 0xf + 2];
            local_158 = pRVar2[lVar6 * 0xf];
            local_150 = pRVar2[lVar6 * 0xf + 1];
            local_148 = pRVar2[lVar6 * 0xf + 2];
            local_140 = pRVar2[lVar7 * 0xf];
            local_138 = pRVar2[lVar7 * 0xf + 1];
            local_130 = pRVar2[lVar7 * 0xf + 2];
            local_128 = pRVar2[lVar11 * 0xf];
            local_120 = pRVar2[lVar11 * 0xf + 1];
            local_118 = pRVar2[lVar11 * 0xf + 2];
            local_50 = pRVar2[lVar13 * 0xf + 2];
            local_110 = (local_158 + pRVar2[lVar12 * 0xf]) * 0.5;
            local_108 = (local_150 + pRVar2[lVar12 * 0xf + 1]) * 0.5;
            local_100 = (local_148 + pRVar2[lVar12 * 0xf + 2]) * 0.5;
            local_f8 = (local_140 + pRVar2[lVar13 * 0xf]) * 0.5;
            local_f0 = (local_138 + pRVar2[lVar13 * 0xf + 1]) * 0.5;
            local_e8 = (local_130 + local_50) * 0.5;
            local_e0 = (local_128 + pRVar2[lVar14 * 0xf]) * 0.5;
            local_d8 = (local_120 + pRVar2[lVar14 * 0xf + 1]) * 0.5;
            local_d0 = (local_118 + pRVar2[lVar14 * 0xf + 2]) * 0.5;
          }
          else {
            if (uVar3 != 0x41) {
LAB_002024b2:
              uVar10 = 0xb;
              uVar5 = 0x800;
              uVar4 = uVar3;
              do {
                iVar8 = (int)uVar10;
                if ((int)uVar5 <= (int)uVar4) {
                  printf("edge %d bit %d\n",uVar10,(ulong)uVar5);
                  uVar4 = uVar4 - uVar5;
                }
                uVar5 = (int)uVar5 / 2;
                uVar10 = (ulong)(iVar8 - 1);
              } while (iVar8 != 0);
              printf("pri %d, map %d\n",uVar9,(ulong)uVar3);
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                     ,0x9e1,"ref_subdiv_test_impossible_marks",6,"map not implemented yet");
              return 6;
            }
            pRVar2 = pRVar1->real;
            lVar6 = (long)local_c8;
            lVar7 = (long)local_c4;
            lVar11 = (long)local_c0;
            lVar12 = (long)local_bc;
            lVar13 = (long)local_b8;
            lVar14 = (long)local_b4;
            local_158 = pRVar2[lVar6 * 0xf];
            local_150 = pRVar2[lVar6 * 0xf + 1];
            local_148 = pRVar2[lVar6 * 0xf + 2];
            local_128 = pRVar2[lVar11 * 0xf];
            local_120 = pRVar2[lVar11 * 0xf + 1];
            local_118 = pRVar2[lVar11 * 0xf + 2];
            local_110 = pRVar2[lVar12 * 0xf];
            local_108 = pRVar2[lVar12 * 0xf + 1];
            local_100 = pRVar2[lVar12 * 0xf + 2];
            local_e0 = pRVar2[lVar14 * 0xf];
            local_d8 = pRVar2[lVar14 * 0xf + 1];
            local_d0 = pRVar2[lVar14 * 0xf + 2];
            local_140 = (local_158 + pRVar2[lVar7 * 0xf]) * 0.5;
            local_138 = (local_150 + pRVar2[lVar7 * 0xf + 1]) * 0.5;
            local_130 = (local_148 + pRVar2[lVar7 * 0xf + 2]) * 0.5;
            local_f8 = (local_110 + pRVar2[lVar13 * 0xf]) * 0.5;
            local_f0 = (local_108 + pRVar2[lVar13 * 0xf + 1]) * 0.5;
            local_e8 = (local_100 + pRVar2[lVar13 * 0xf + 2]) * 0.5;
          }
        }
        else {
          if (uVar3 == 0x82) {
            pRVar2 = pRVar1->real;
            lVar6 = (long)local_c8;
            lVar7 = (long)local_c4;
            lVar11 = (long)local_c0;
            lVar12 = (long)local_bc;
            lVar13 = (long)local_b8;
            lVar14 = (long)local_b4;
            local_158 = pRVar2[lVar6 * 0xf];
            local_150 = pRVar2[lVar6 * 0xf + 1];
            local_148 = pRVar2[lVar6 * 0xf + 2];
            local_140 = pRVar2[lVar7 * 0xf];
            local_138 = pRVar2[lVar7 * 0xf + 1];
            local_130 = pRVar2[lVar7 * 0xf + 2];
            local_110 = pRVar2[lVar12 * 0xf];
            RVar15 = pRVar2[lVar12 * 0xf + 1];
            local_100 = pRVar2[lVar12 * 0xf + 2];
            local_f8 = pRVar2[lVar13 * 0xf];
            local_f0 = pRVar2[lVar13 * 0xf + 1];
            local_e8 = pRVar2[lVar13 * 0xf + 2];
            RVar16 = pRVar2[lVar14 * 0xf + 1];
            local_128 = local_158 + pRVar2[lVar11 * 0xf];
            local_d0 = local_100 + pRVar2[lVar14 * 0xf + 2];
            local_120 = local_150 + pRVar2[lVar11 * 0xf + 1];
            local_118 = local_148 + pRVar2[lVar11 * 0xf + 2];
            local_e0 = local_110 + pRVar2[lVar14 * 0xf];
            local_108 = RVar15;
          }
          else {
            if (uVar3 != 0x108) {
              if (uVar3 != 0x1cb) goto LAB_002024b2;
              pRVar2 = pRVar1->real;
              lVar6 = (long)local_c8;
              local_158 = pRVar2[lVar6 * 0xf];
              local_150 = pRVar2[lVar6 * 0xf + 1];
              local_148 = pRVar2[lVar6 * 0xf + 2];
              lVar6 = (long)local_c4;
              lVar7 = (long)local_c0;
              local_48 = pRVar2[lVar7 * 0xf + 2];
              lVar11 = (long)local_bc;
              local_110 = pRVar2[lVar11 * 0xf];
              local_108 = pRVar2[lVar11 * 0xf + 1];
              local_100 = pRVar2[lVar11 * 0xf + 2];
              lVar11 = (long)local_b8;
              lVar12 = (long)local_b4;
              local_40 = pRVar2[lVar12 * 0xf];
              local_50 = pRVar2[lVar12 * 0xf + 1];
              local_140 = (pRVar2[lVar6 * 0xf] + local_158) * 0.5;
              local_138 = (pRVar2[lVar6 * 0xf + 1] + local_150) * 0.5;
              local_130 = (pRVar2[lVar6 * 0xf + 2] + local_148) * 0.5;
              local_128 = (local_158 + pRVar2[lVar7 * 0xf]) * 0.5;
              local_120 = (local_150 + pRVar2[lVar7 * 0xf + 1]) * 0.5;
              local_118 = (local_148 + local_48) * 0.5;
              local_f8 = (pRVar2[lVar11 * 0xf] + local_110) * 0.5;
              local_f0 = (pRVar2[lVar11 * 0xf + 1] + local_108) * 0.5;
              local_e8 = (local_100 + pRVar2[lVar11 * 0xf + 2]) * 0.5;
              local_e0 = (local_110 + local_40) * 0.5;
              local_d8 = (local_108 + local_50) * 0.5;
              local_d0 = (pRVar2[lVar12 * 0xf + 2] + local_100) * 0.5;
              ref_subdiv_test_pri((REF_DBL (*) [3])&local_158,&local_34);
              pRVar2 = pRVar1->real;
              lVar6 = (long)local_c8;
              lVar7 = (long)local_c4;
              local_140 = pRVar2[lVar7 * 0xf];
              local_138 = pRVar1->real[lVar7 * 0xf + 1];
              local_130 = pRVar1->real[lVar7 * 0xf + 2];
              local_f8 = pRVar1->real[(long)local_b8 * 0xf];
              local_f0 = pRVar1->real[(long)local_b8 * 0xf + 1];
              local_e8 = pRVar1->real[(long)local_b8 * 0xf + 2];
              local_158 = (pRVar2[lVar6 * 0xf] + local_140) * 0.5;
              local_150 = (pRVar2[lVar6 * 0xf + 1] + local_138) * 0.5;
              local_148 = (pRVar2[lVar6 * 0xf + 2] + local_130) * 0.5;
              local_128 = (pRVar1->real[(long)local_c0 * 0xf] + local_140) * 0.5;
              local_120 = (pRVar1->real[(long)local_c0 * 0xf + 1] + local_138) * 0.5;
              local_118 = (pRVar1->real[(long)local_c0 * 0xf + 2] + local_130) * 0.5;
              local_110 = (pRVar1->real[(long)local_bc * 0xf] + local_f8) * 0.5;
              local_108 = (pRVar1->real[(long)local_bc * 0xf + 1] + local_f0) * 0.5;
              local_100 = (pRVar1->real[(long)local_bc * 0xf + 2] + local_e8) * 0.5;
              local_e0 = (pRVar1->real[(long)local_b4 * 0xf] + local_f8) * 0.5;
              local_d8 = (pRVar1->real[(long)local_b4 * 0xf + 1] + local_f0) * 0.5;
              local_d0 = (pRVar1->real[(long)local_b4 * 0xf + 2] + local_e8) * 0.5;
              ref_subdiv_test_pri((REF_DBL (*) [3])&local_158,&local_34);
              lVar6 = (long)local_c8;
              local_128 = pRVar1->real[(long)local_c0 * 0xf];
              local_120 = pRVar1->real[(long)local_c0 * 0xf + 1];
              local_118 = pRVar1->real[(long)local_c0 * 0xf + 2];
              local_e0 = pRVar1->real[(long)local_b4 * 0xf];
              local_d8 = pRVar1->real[(long)local_b4 * 0xf + 1];
              local_d0 = pRVar1->real[(long)local_b4 * 0xf + 2];
              local_158 = (pRVar1->real[lVar6 * 0xf] + local_128) * 0.5;
              local_150 = (pRVar1->real[lVar6 * 0xf + 1] + local_120) * 0.5;
              local_148 = (pRVar1->real[lVar6 * 0xf + 2] + local_118) * 0.5;
              local_140 = (pRVar1->real[(long)local_c4 * 0xf] + local_128) * 0.5;
              local_138 = (pRVar1->real[(long)local_c4 * 0xf + 1] + local_120) * 0.5;
              local_130 = (pRVar1->real[(long)local_c4 * 0xf + 2] + local_118) * 0.5;
              local_110 = (pRVar1->real[(long)local_bc * 0xf] + local_e0) * 0.5;
              local_108 = (pRVar1->real[(long)local_bc * 0xf + 1] + local_d8) * 0.5;
              local_100 = (pRVar1->real[(long)local_bc * 0xf + 2] + local_d0) * 0.5;
              local_f8 = (pRVar1->real[(long)local_b8 * 0xf] + local_e0) * 0.5;
              local_f0 = (pRVar1->real[(long)local_b8 * 0xf + 1] + local_d8) * 0.5;
              local_e8 = (pRVar1->real[(long)local_b8 * 0xf + 2] + local_d0) * 0.5;
              ref_subdiv_test_pri((REF_DBL (*) [3])&local_158,&local_34);
              lVar6 = (long)local_c8;
              lVar7 = (long)local_c4;
              local_158 = (pRVar1->real[lVar6 * 0xf] + pRVar1->real[lVar7 * 0xf]) * 0.5;
              local_150 = (pRVar1->real[lVar6 * 0xf + 1] + pRVar1->real[lVar7 * 0xf + 1]) * 0.5;
              local_148 = (pRVar1->real[lVar6 * 0xf + 2] + pRVar1->real[lVar7 * 0xf + 2]) * 0.5;
              local_140 = (pRVar1->real[(long)local_c4 * 0xf] + pRVar1->real[(long)local_c0 * 0xf])
                          * 0.5;
              local_138 = (pRVar1->real[(long)local_c4 * 0xf + 1] +
                          pRVar1->real[(long)local_c0 * 0xf + 1]) * 0.5;
              local_130 = (pRVar1->real[(long)local_c4 * 0xf + 2] +
                          pRVar1->real[(long)local_c0 * 0xf + 2]) * 0.5;
              local_128 = (pRVar1->real[(long)local_c0 * 0xf] + pRVar1->real[(long)local_c8 * 0xf])
                          * 0.5;
              local_120 = (pRVar1->real[(long)local_c0 * 0xf + 1] +
                          pRVar1->real[(long)local_c8 * 0xf + 1]) * 0.5;
              local_118 = (pRVar1->real[(long)local_c0 * 0xf + 2] +
                          pRVar1->real[(long)local_c8 * 0xf + 2]) * 0.5;
              local_110 = (pRVar1->real[(long)local_bc * 0xf] + pRVar1->real[(long)local_b8 * 0xf])
                          * 0.5;
              local_108 = (pRVar1->real[(long)local_bc * 0xf + 1] +
                          pRVar1->real[(long)local_b8 * 0xf + 1]) * 0.5;
              local_100 = (pRVar1->real[(long)local_bc * 0xf + 2] +
                          pRVar1->real[(long)local_b8 * 0xf + 2]) * 0.5;
              local_f8 = (pRVar1->real[(long)local_b8 * 0xf] + pRVar1->real[(long)local_b4 * 0xf]) *
                         0.5;
              local_f0 = (pRVar1->real[(long)local_b8 * 0xf + 1] +
                         pRVar1->real[(long)local_b4 * 0xf + 1]) * 0.5;
              local_e8 = (pRVar1->real[(long)local_b8 * 0xf + 2] +
                         pRVar1->real[(long)local_b4 * 0xf + 2]) * 0.5;
              local_e0 = (pRVar1->real[(long)local_b4 * 0xf] + pRVar1->real[(long)local_c8 * 0xf]) *
                         0.5;
              local_d8 = (pRVar1->real[(long)local_b4 * 0xf + 1] +
                         pRVar1->real[(long)local_c8 * 0xf + 1]) * 0.5;
              local_d0 = (pRVar1->real[(long)local_b4 * 0xf + 2] +
                         pRVar1->real[(long)local_c8 * 0xf + 2]) * 0.5;
              goto LAB_00202477;
            }
            pRVar2 = pRVar1->real;
            lVar6 = (long)local_c8;
            lVar7 = (long)local_c4;
            lVar11 = (long)local_c0;
            lVar12 = (long)local_bc;
            lVar13 = (long)local_b8;
            lVar14 = (long)local_b4;
            local_158 = pRVar2[lVar6 * 0xf];
            local_150 = pRVar2[lVar6 * 0xf + 1];
            local_148 = pRVar2[lVar6 * 0xf + 2];
            local_140 = pRVar2[lVar7 * 0xf];
            local_138 = pRVar2[lVar7 * 0xf + 1];
            local_130 = pRVar2[lVar7 * 0xf + 2];
            local_110 = pRVar2[lVar12 * 0xf];
            local_100 = pRVar2[lVar12 * 0xf + 2];
            local_f8 = pRVar2[lVar13 * 0xf];
            RVar15 = pRVar2[lVar13 * 0xf + 1];
            local_e8 = pRVar2[lVar13 * 0xf + 2];
            RVar16 = pRVar2[lVar14 * 0xf + 1];
            local_128 = local_140 + pRVar2[lVar11 * 0xf];
            local_d0 = local_e8 + pRVar2[lVar14 * 0xf + 2];
            local_120 = local_138 + pRVar2[lVar11 * 0xf + 1];
            local_118 = local_130 + pRVar2[lVar11 * 0xf + 2];
            local_e0 = local_f8 + pRVar2[lVar14 * 0xf];
            local_108 = pRVar2[lVar12 * 0xf + 1];
            local_f0 = RVar15;
          }
          local_e0 = local_e0 * 0.5;
          local_118 = local_118 * 0.5;
          local_120 = local_120 * 0.5;
          local_128 = local_128 * 0.5;
          local_d8 = (RVar15 + RVar16) * 0.5;
          local_d0 = local_d0 * 0.5;
        }
LAB_00202477:
        ref_subdiv_test_pri((REF_DBL (*) [3])&local_158,&local_34);
      }
LAB_00202487:
      uVar9 = (ulong)(iVar8 + 1U);
    } while ((int)(iVar8 + 1U) < ref_cell->max);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_subdiv_test_impossible_marks(REF_SUBDIV ref_subdiv) {
  REF_INT cell;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL xyz[6][3];
  REF_INT map;
  REF_BOOL possible;
  ref_node = ref_grid_node(ref_subdiv_grid(ref_subdiv));

  ref_cell = ref_grid_pri(ref_subdiv_grid(ref_subdiv));

  each_ref_cell_valid_cell(ref_cell, cell) {
    map = ref_subdiv_map(ref_subdiv, ref_cell, cell);
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
    switch (map) {
      case 0: /* don't split */
        break;
      case 52: /* prism split top and bottom, edges 2,4,5 */
        fill_pri_xyz(ref_node, nodes, xyz);
        replace_xyz0_avg(xyz, 0, 3);
        replace_xyz0_avg(xyz, 1, 4);
        replace_xyz0_avg(xyz, 2, 5);

        fill_pri_xyz(ref_node, nodes, xyz);
        replace_xyz0_avg(xyz, 3, 0);
        replace_xyz0_avg(xyz, 4, 1);
        replace_xyz0_avg(xyz, 5, 2);
        RSS(ref_subdiv_test_pri(xyz, &possible), "test pri");

        break;
      case 65: /* prism split edges 0, 6 */
        fill_pri_xyz(ref_node, nodes, xyz);
        replace_xyz0_avg(xyz, 0, 1);
        replace_xyz0_avg(xyz, 3, 4);

        fill_pri_xyz(ref_node, nodes, xyz);
        replace_xyz0_avg(xyz, 1, 0);
        replace_xyz0_avg(xyz, 4, 3);
        RSS(ref_subdiv_test_pri(xyz, &possible), "test pri");

        break;
      case 130: /* prism split edges 1, 7 */
        fill_pri_xyz(ref_node, nodes, xyz);
        replace_xyz0_avg(xyz, 0, 2);
        replace_xyz0_avg(xyz, 3, 5);

        fill_pri_xyz(ref_node, nodes, xyz);
        replace_xyz0_avg(xyz, 2, 0);
        replace_xyz0_avg(xyz, 5, 3);
        RSS(ref_subdiv_test_pri(xyz, &possible), "test pri");

        break;
      case 264: /* prism split edges 3, 8 */
        fill_pri_xyz(ref_node, nodes, xyz);
        replace_xyz0_avg(xyz, 1, 2);
        replace_xyz0_avg(xyz, 4, 5);

        fill_pri_xyz(ref_node, nodes, xyz);
        replace_xyz0_avg(xyz, 2, 1);
        replace_xyz0_avg(xyz, 5, 4);
        RSS(ref_subdiv_test_pri(xyz, &possible), "test pri");

        break;
      case 459: /* prism split */
        /* near edge 0-3 */
        fill_pri_xyz(ref_node, nodes, xyz);
        replace_xyz0_avg(xyz, 1, 0);
        replace_xyz0_avg(xyz, 2, 0);
        replace_xyz0_avg(xyz, 4, 3);
        replace_xyz0_avg(xyz, 5, 3);
        RSS(ref_subdiv_test_pri(xyz, &possible), "test pri");

        /* near edge 1-4 */
        fill_pri_xyz(ref_node, nodes, xyz);
        replace_xyz0_avg(xyz, 0, 1);
        replace_xyz0_avg(xyz, 2, 1);
        replace_xyz0_avg(xyz, 3, 4);
        replace_xyz0_avg(xyz, 5, 4);
        RSS(ref_subdiv_test_pri(xyz, &possible), "test pri");

        /* near edge 2-5 */
        fill_pri_xyz(ref_node, nodes, xyz);
        replace_xyz0_avg(xyz, 0, 2);
        replace_xyz0_avg(xyz, 1, 2);
        replace_xyz0_avg(xyz, 3, 5);
        replace_xyz0_avg(xyz, 4, 5);
        RSS(ref_subdiv_test_pri(xyz, &possible), "test pri");

        /* center */
        fill_xyz_avg(xyz, 0, 0, 1);
        fill_xyz_avg(xyz, 1, 1, 2);
        fill_xyz_avg(xyz, 2, 2, 0);

        fill_xyz_avg(xyz, 3, 3, 4);
        fill_xyz_avg(xyz, 4, 4, 5);
        fill_xyz_avg(xyz, 5, 5, 0);
        RSS(ref_subdiv_test_pri(xyz, &possible), "test pri");

        break;
      default:
        RSS(ref_subdiv_map_to_edge(map), "map2edge");
        printf("pri %d, map %d\n", cell, map);
        RSS(REF_IMPLEMENT, "map not implemented yet")
    }
  }

  return REF_SUCCESS;
}